

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall
glslang::TSymbolTableLevel::dump(TSymbolTableLevel *this,TInfoSink *infoSink,bool complete)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->level)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(*(long *)p_Var1[2]._M_parent + 0x98))(p_Var1[2]._M_parent,infoSink,complete);
  }
  return;
}

Assistant:

void TSymbolTableLevel::dump(TInfoSink& infoSink, bool complete) const
{
    tLevel::const_iterator it;
    for (it = level.begin(); it != level.end(); ++it)
        (*it).second->dump(infoSink, complete);
}